

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_double_suite::test_exponential_increase(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  double absolute_tolerance;
  double *in_stack_fffffffffffffe98;
  double local_158;
  value_type local_150;
  value_type local_148;
  double local_138;
  value_type local_130;
  value_type local_128;
  double local_118;
  value_type local_110;
  value_type local_108;
  double local_f8;
  value_type local_f0;
  value_type local_e8;
  double local_d8;
  value_type local_d0;
  value_type local_c8;
  double local_b8;
  value_type local_b0;
  value_type local_a8;
  double local_98;
  value_type local_90;
  value_type local_88;
  double local_78;
  value_type local_70;
  value_type local_68;
  double local_58;
  value_type local_50 [4];
  undefined1 local_30 [8];
  moment<double> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.sum,1e-05,absolute_tolerance);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::basic_moment
            ((basic_moment<double,_(trial::online::with)1> *)local_30,0.125);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,1.0);
  local_50[2] = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_50[1] = 1.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0xb3,"void mean_double_suite::test_exponential_increase()",local_50 + 2,local_50 + 1);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,10.0);
  local_50[0] = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_58 = 5.8;
  local_68 = filter.sum.mean;
  predicate_07.absolute = tolerance.relative;
  predicate_07.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.8","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xb5,0x1116e1,(char *)local_50,&local_58,in_stack_fffffffffffffe98,
             predicate_07);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,100.0);
  local_70 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_78 = 41.473;
  local_88 = filter.sum.mean;
  predicate_06.absolute = tolerance.relative;
  predicate_06.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","41.473","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xb7,0x1116e1,(char *)&local_70,&local_78,in_stack_fffffffffffffe98,
             predicate_06);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,1000.0);
  local_90 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_98 = 331.01;
  local_a8 = filter.sum.mean;
  predicate_05.absolute = tolerance.relative;
  predicate_05.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","331.01","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xb9,0x1116e1,(char *)&local_90,&local_98,in_stack_fffffffffffffe98,
             predicate_05);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,10000.0);
  local_b0 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_b8 = 2812.32;
  local_c8 = filter.sum.mean;
  predicate_04.absolute = tolerance.relative;
  predicate_04.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2812.32","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xbb,0x1116e1,(char *)&local_b0,&local_b8,in_stack_fffffffffffffe98,
             predicate_04);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,100000.0);
  local_d0 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_d8 = 24852.2;
  local_e8 = filter.sum.mean;
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","24852.2","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xbd,0x1116e1,(char *)&local_d0,&local_d8,in_stack_fffffffffffffe98,
             predicate_03);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,1000000.0);
  local_f0 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_f8 = 225565.0;
  local_108 = filter.sum.mean;
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","225565.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xbf,0x1116e1,(char *)&local_f0,&local_f8,in_stack_fffffffffffffe98,
             predicate_02);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,10000000.0);
  local_110 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_118 = 2086960.0;
  local_128 = filter.sum.mean;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.08696e6","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xc1,0x1116e1,(char *)&local_110,&local_118,in_stack_fffffffffffffe98,
             predicate_01);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,100000000.0);
  local_130 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_138 = 19587900.0;
  local_148 = filter.sum.mean;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.95879e7","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xc3,0x1116e1,(char *)&local_130,&local_138,in_stack_fffffffffffffe98,
             predicate_00);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,1000000000.0);
  local_150 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_158 = 185889000.0;
  predicate.absolute = tolerance.relative;
  predicate.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.85889e8","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xc5,0x1116e1,(char *)&local_150,&local_158,(double *)filter.sum.mean,
             predicate);
  return;
}

Assistant:

void test_exponential_increase()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    decay::moment<double> filter(one_over_eight);

    filter.push(1e0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    filter.push(1e1);
    TRIAL_TEST_WITH(filter.mean(), 5.8, tolerance);
    filter.push(1e2);
    TRIAL_TEST_WITH(filter.mean(), 41.473, tolerance);
    filter.push(1e3);
    TRIAL_TEST_WITH(filter.mean(), 331.01, tolerance);
    filter.push(1e4);
    TRIAL_TEST_WITH(filter.mean(), 2812.32, tolerance);
    filter.push(1e5);
    TRIAL_TEST_WITH(filter.mean(), 24852.2, tolerance);
    filter.push(1e6);
    TRIAL_TEST_WITH(filter.mean(), 225565.0, tolerance);
    filter.push(1e7);
    TRIAL_TEST_WITH(filter.mean(), 2.08696e6, tolerance);
    filter.push(1e8);
    TRIAL_TEST_WITH(filter.mean(), 1.95879e7, tolerance);
    filter.push(1e9);
    TRIAL_TEST_WITH(filter.mean(), 1.85889e8, tolerance);
}